

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location_impl.hpp
# Opt level: O0

size_t toml::detail::integer_width_base10(size_t i)

{
  size_t width;
  size_t i_local;
  
  width = 0;
  for (i_local = i; i_local != 0; i_local = i_local / 10) {
    width = width + 1;
  }
  return width;
}

Assistant:

TOML11_INLINE std::size_t integer_width_base10(std::size_t i) noexcept
{
    std::size_t width = 0;
    while(i != 0)
    {
        i /= 10;
        width += 1;
    }
    return width;
}